

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O1

int64_t __thiscall nuraft::buffer_serializer::get_i64(buffer_serializer *this)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  byte *pbVar4;
  byte *pbVar5;
  overflow_error *this_00;
  ulong uVar6;
  
  sVar2 = this->pos_;
  sVar3 = buffer::size(this->buf_);
  if (sVar2 + 8 <= sVar3) {
    pbVar4 = buffer::data_begin(this->buf_);
    pbVar5 = pbVar4 + this->pos_;
    if (this->endian_ == LITTLE) {
      uVar6 = (ulong)*(ushort *)(pbVar5 + 1) |
              CONCAT44((uint)pbVar5[5] | (uint)pbVar5[6] << 8 | (uint)pbVar5[7] << 0x10,
                       (uint)pbVar5[3] << 0x10 | (uint)pbVar5[4] << 0x18);
    }
    else {
      uVar6 = (ulong)(ushort)(*(ushort *)(pbVar5 + 5) << 8 | *(ushort *)(pbVar5 + 5) >> 8) |
              CONCAT44((uint)pbVar5[2] | (uint)pbVar5[1] << 8 | (uint)*pbVar5 << 0x10,
                       (uint)pbVar5[4] << 0x10 | (uint)pbVar5[3] << 0x18);
      pbVar5 = pbVar5 + 7;
    }
    bVar1 = *pbVar5;
    pos(this,this->pos_ + 8);
    return (ulong)bVar1 | uVar6 << 8;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"not enough space");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

int64_t buffer_serializer::get_i64() {
    int64_t ret = 0;
    chk_length(ret);
    uint8_t* ptr = buf_.data_begin() + pos_;
    if (endian_ == LITTLE)  { get64l(ptr, ret); }
    else                    { get64b(ptr, ret); }
    pos( pos() + sizeof(ret) );
    return ret;
}